

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001825e0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001825e7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001825d0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001825d8 = 0x2d2d2d2d2d2d2d;
    DAT_001825df = 0x2d;
    _DAT_001825c0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001825c8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001825b0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001825b8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001825a8 = 0x2d2d2d2d2d2d2d2d;
    DAT_001825ef = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }